

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O3

ChangeInfo *
capnp::compiler::anon_unknown_0::fieldExpandGroup
          (ChangeInfo *__return_storage_ptr__,Builder decl,uint *nextOrdinal,bool scopeHasUnion)

{
  SegmentBuilder *pSVar1;
  CapTableBuilder *pCVar2;
  void *pvVar3;
  size_t sVar4;
  ChangeInfo *pCVar5;
  uint uVar6;
  char *pcVar7;
  StringPtr *params_1;
  undefined7 in_register_00000011;
  WirePointer *pWVar8;
  Reader value;
  Reader value_00;
  Builder newDecl;
  StructBuilder local_168;
  undefined4 local_13c;
  undefined1 local_138 [48];
  StructBuilder local_108;
  PointerBuilder local_d8;
  String local_b8;
  uint *local_98;
  ChangeInfo *local_90;
  SegmentBuilder *local_88;
  SegmentBuilder *pSStack_80;
  ChangeInfo local_78;
  ArrayPtr<const_char> local_58;
  Builder local_48;
  
  local_13c = (undefined4)CONCAT71(in_register_00000011,scopeHasUnion);
  local_168.data = decl._builder.pointers + 2;
  local_168.segment = decl._builder.segment;
  local_168.capTable = decl._builder.capTable;
  local_98 = nextOrdinal;
  local_90 = __return_storage_ptr__;
  capnp::_::PointerBuilder::initStructList
            ((ListBuilder *)local_138,(PointerBuilder *)&local_168,1,(StructSize)0x80002);
  capnp::_::ListBuilder::getStructElement(&local_108,(ListBuilder *)local_138,0);
  local_d8.segment = decl._builder.segment;
  local_d8.capTable = decl._builder.capTable;
  local_d8.pointer = decl._builder.pointers;
  capnp::_::PointerBuilder::disown((OrphanBuilder *)local_138,&local_d8);
  local_168.capTable = (CapTableBuilder *)local_138._8_8_;
  local_168.data = (void *)local_138._16_8_;
  local_168.pointers = (WirePointer *)local_138._24_8_;
  local_168.segment = (SegmentBuilder *)local_138._0_8_;
  local_138._0_8_ = local_108.segment;
  local_138._8_8_ = local_108.capTable;
  local_138._16_8_ = local_108.pointers;
  capnp::_::PointerBuilder::adopt((PointerBuilder *)local_138,(OrphanBuilder *)&local_168);
  if ((SegmentBuilder *)local_168.capTable != (SegmentBuilder *)0x0) {
    capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)&local_168);
  }
  pvVar3 = local_108.data;
  local_d8.pointer = decl._builder.pointers + 1;
  local_d8.segment = decl._builder.segment;
  local_d8.capTable = decl._builder.capTable;
  pWVar8 = local_108.pointers + 1;
  local_88 = local_108.segment;
  pSStack_80 = (SegmentBuilder *)local_108.capTable;
  capnp::_::PointerBuilder::disown((OrphanBuilder *)local_138,&local_d8);
  local_168.capTable = (CapTableBuilder *)local_138._8_8_;
  local_168.data = (void *)local_138._16_8_;
  local_168.pointers = (WirePointer *)local_138._24_8_;
  local_168.segment = (SegmentBuilder *)local_138._0_8_;
  *(undefined2 *)pvVar3 = 2;
  local_138._0_8_ = local_88;
  local_138._8_8_ = pSStack_80;
  local_138._16_8_ = pWVar8;
  capnp::_::PointerBuilder::adopt((PointerBuilder *)local_138,(OrphanBuilder *)&local_168);
  if ((SegmentBuilder *)local_168.capTable != (SegmentBuilder *)0x0) {
    capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)&local_168);
  }
  *(undefined2 *)((long)local_108.data + 2) = 6;
  *(undefined2 *)((long)local_108.data + 0xc) = 0;
  local_138._16_8_ = local_108.pointers + 5;
  local_138._0_8_ = local_108.segment;
  local_138._8_8_ = local_108.capTable;
  capnp::_::PointerBuilder::clear((PointerBuilder *)local_138);
  local_138._16_8_ = local_108.pointers + 6;
  local_138._0_8_ = local_108.segment;
  local_138._8_8_ = local_108.capTable;
  capnp::_::PointerBuilder::clear((PointerBuilder *)local_138);
  pWVar8 = local_108.pointers;
  pCVar2 = local_108.capTable;
  pSVar1 = local_108.segment;
  local_d8.pointer = decl._builder.pointers + 5;
  local_d8.segment = decl._builder.segment;
  local_d8.capTable = decl._builder.capTable;
  capnp::_::PointerBuilder::disown((OrphanBuilder *)local_138,&local_d8);
  local_168.capTable = (CapTableBuilder *)local_138._8_8_;
  local_168.data = (void *)local_138._16_8_;
  local_168.pointers = (WirePointer *)local_138._24_8_;
  local_168.segment = (SegmentBuilder *)local_138._0_8_;
  local_138._16_8_ = pWVar8 + 5;
  local_138._0_8_ = pSVar1;
  local_138._8_8_ = pCVar2;
  capnp::_::PointerBuilder::adopt((PointerBuilder *)local_138,(OrphanBuilder *)&local_168);
  if ((SegmentBuilder *)local_168.capTable != (SegmentBuilder *)0x0) {
    capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)&local_168);
  }
  if (*(short *)((long)decl._builder.data + 0xc) == 1) {
    local_d8.pointer = decl._builder.pointers + 6;
    local_d8.segment = decl._builder.segment;
    local_d8.capTable = decl._builder.capTable;
    capnp::_::PointerBuilder::disown((OrphanBuilder *)local_138,&local_d8);
    local_168.capTable = (CapTableBuilder *)local_138._8_8_;
    local_168.data = (void *)local_138._16_8_;
    local_168.pointers = (WirePointer *)local_138._24_8_;
    local_168.segment = (SegmentBuilder *)local_138._0_8_;
    *(undefined2 *)((long)local_108.data + 0xc) = 1;
    local_138._16_8_ = pWVar8 + 6;
    local_138._0_8_ = pSVar1;
    local_138._8_8_ = pCVar2;
    capnp::_::PointerBuilder::adopt((PointerBuilder *)local_138,(OrphanBuilder *)&local_168);
    if ((SegmentBuilder *)local_168.capTable != (SegmentBuilder *)0x0) {
      capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)&local_168);
    }
  }
  else {
    *(undefined2 *)((long)local_108.data + 0xc) = 0;
  }
  local_168.segment = decl._builder.segment;
  local_168.capTable = decl._builder.capTable;
  local_168.data = decl._builder.pointers;
  capnp::_::PointerBuilder::initStruct
            ((StructBuilder *)local_138,(PointerBuilder *)&local_168,(StructSize)0x10001);
  local_d8.segment = local_108.segment;
  local_d8.capTable = local_108.capTable;
  local_d8.pointer = local_108.pointers;
  capnp::_::PointerBuilder::getStruct(&local_168,&local_d8,(StructSize)0x10001,(word *)0x0);
  local_d8.segment = local_168.segment;
  local_d8.capTable = local_168.capTable;
  local_d8.pointer = local_168.pointers;
  params_1 = (StringPtr *)0x0;
  capnp::_::PointerBuilder::getBlob<capnp::Text>(&local_48,&local_d8,(void *)0x0,0);
  local_d8.segment = (SegmentBuilder *)0x1d75cf;
  local_d8.capTable = (CapTableBuilder *)0x1;
  local_58.ptr = local_48.content.ptr;
  local_58.size_ = local_48.content.size_;
  kj::_::concat<kj::ArrayPtr<char_const>,kj::StringPtr>(&local_b8,(_ *)&local_d8,&local_58,params_1)
  ;
  pcVar7 = local_b8.content.ptr;
  if (local_b8.content.size_ == 0) {
    pcVar7 = "";
  }
  value.super_StringPtr.content.size_ = local_b8.content.size_ + (local_b8.content.size_ == 0);
  local_d8.segment = (SegmentBuilder *)local_138._0_8_;
  local_d8.capTable = (CapTableBuilder *)local_138._8_8_;
  local_d8.pointer = (WirePointer *)local_138._24_8_;
  value.super_StringPtr.content.ptr = pcVar7;
  capnp::_::PointerBuilder::setBlob<capnp::Text>(&local_d8,value);
  sVar4 = local_b8.content.size_;
  pcVar7 = local_b8.content.ptr;
  if (local_b8.content.ptr != (char *)0x0) {
    local_b8.content.ptr = (char *)0x0;
    local_b8.content.size_ = 0;
    (*(code *)**(undefined8 **)local_b8.content.disposer)
              (local_b8.content.disposer,pcVar7,1,sVar4,sVar4,0);
  }
  *(undefined2 *)decl._builder.data = 0;
  uVar6 = rand();
  if ((uVar6 & 1) == 0) {
    *(undefined2 *)((long)decl._builder.data + 2) = 8;
  }
  else {
    *(undefined2 *)((long)decl._builder.data + 2) = 7;
    if (((char)local_13c == '\0') && (uVar6 = rand(), (uVar6 & 1) == 0)) {
      local_168.segment = decl._builder.segment;
      local_168.capTable = decl._builder.capTable;
      local_168.data = decl._builder.pointers;
      capnp::_::PointerBuilder::getStruct
                ((StructBuilder *)local_138,(PointerBuilder *)&local_168,(StructSize)0x10001,
                 (word *)0x0);
      local_168.segment = (SegmentBuilder *)local_138._0_8_;
      local_168.capTable = (CapTableBuilder *)local_138._8_8_;
      local_168.data = (void *)local_138._24_8_;
      value_00.super_StringPtr.content.size_ = 1;
      value_00.super_StringPtr.content.ptr = "";
      capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_168,value_00);
    }
    structAddField(&local_78,decl,local_98,false);
    sVar4 = local_78.description.content.size_;
    pcVar7 = local_78.description.content.ptr;
    if (local_78.description.content.ptr != (char *)0x0) {
      local_78.description.content.ptr = (char *)0x0;
      local_78.description.content.size_ = 0;
      (*(code *)**(undefined8 **)local_78.description.content.disposer)
                (local_78.description.content.disposer,pcVar7,1,sVar4,sVar4,0);
    }
  }
  pCVar5 = local_90;
  local_90->kind = COMPATIBLE;
  kj::heapString(&local_90->description,0x22);
  pcVar7 = (char *)(pCVar5->description).content.size_;
  if (pcVar7 != (char *)0x0) {
    pcVar7 = (pCVar5->description).content.ptr;
  }
  builtin_strncpy(pcVar7,"Wrap a field in a singleton group.",0x22);
  return pCVar5;
}

Assistant:

static ChangeInfo fieldExpandGroup(Declaration::Builder decl, uint& nextOrdinal,
                                   bool scopeHasUnion) {
  Declaration::Builder newDecl = decl.initNestedDecls(1)[0];
  newDecl.adoptName(decl.disownName());
  newDecl.getId().adoptOrdinal(decl.getId().disownOrdinal());

  auto field = decl.getField();
  auto newField = newDecl.initField();

  newField.adoptType(field.disownType());
  if (field.getDefaultValue().isValue()) {
    newField.getDefaultValue().adoptValue(field.getDefaultValue().disownValue());
  } else {
    newField.getDefaultValue().setNone();
  }

  decl.initName().setValue(kj::str("g", newDecl.getName().getValue()));
  decl.getId().setUnspecified();

  if (rand() % 2 == 0) {
    decl.setGroup();
  } else {
    decl.setUnion();
    if (!scopeHasUnion && rand() % 2 == 0) {
      // Make it an unnamed union.
      decl.getName().setValue("");
    }
    structAddField(decl, nextOrdinal, scopeHasUnion);  // union must have two members
  }

  return { COMPATIBLE, "Wrap a field in a singleton group." };
}